

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O2

char * string2chars(string *str)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  char *pcVar4;
  int i;
  size_type sVar5;
  ulong uVar6;
  long lVar7;
  
  sVar1 = str->_M_string_length;
  lVar7 = sVar1 << 0x20;
  uVar3 = lVar7 + 0x100000000 >> 0x20;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar6 = uVar3;
  }
  pcVar4 = (char *)operator_new__(uVar6);
  pcVar2 = (str->_M_dataplus)._M_p;
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    pcVar4[sVar5] = pcVar2[sVar5];
  }
  pcVar4[lVar7 >> 0x20] = '\0';
  return pcVar4;
}

Assistant:

char *string2chars(const string &str) {
    int len = str.length();
    auto *chars = new char[len + 1];
    for (int i = 0; i < str.length(); i++) {
        chars[i] = str[i];
    }
    chars[len] = 0;
    return chars;
}